

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

void __thiscall AmpIO::AmpIO(AmpIO *this,uint8_t board_id)

{
  EncoderVelocity *local_30;
  uint8_t board_id_local;
  AmpIO *this_local;
  
  FpgaIO::FpgaIO(&this->super_FpgaIO,board_id);
  (this->super_FpgaIO).super_BoardIO._vptr_BoardIO = (_func_int **)&PTR_InitBoard_0012e5c0;
  this->NumMotors = 0;
  this->NumEncoders = 0;
  this->NumDouts = 0;
  local_30 = this->encVelData;
  do {
    EncoderVelocity::EncoderVelocity(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (EncoderVelocity *)this->encErrorCount);
  this->dallasState = ST_DALLAS_START;
  this->dallasTimeoutSec = 10.0;
  this->collect_state = false;
  this->collect_cb = (CollectCallback)0x0;
  this->ReadBuffer[0x3c] = 0;
  this->ReadBuffer[0x3d] = 0;
  this->ReadBuffer[0x3e] = 0;
  this->ReadBuffer[0x3f] = 0;
  this->ReadBuffer[0x38] = 0;
  this->ReadBuffer[0x39] = 0;
  this->ReadBuffer[0x3a] = 0;
  this->ReadBuffer[0x3b] = 0;
  this->ReadBuffer[0x34] = 0;
  this->ReadBuffer[0x35] = 0;
  this->ReadBuffer[0x36] = 0;
  this->ReadBuffer[0x37] = 0;
  this->ReadBuffer[0x30] = 0;
  this->ReadBuffer[0x31] = 0;
  this->ReadBuffer[0x32] = 0;
  this->ReadBuffer[0x33] = 0;
  this->ReadBuffer[0x2c] = 0;
  this->ReadBuffer[0x2d] = 0;
  this->ReadBuffer[0x2e] = 0;
  this->ReadBuffer[0x2f] = 0;
  this->ReadBuffer[0x28] = 0;
  this->ReadBuffer[0x29] = 0;
  this->ReadBuffer[0x2a] = 0;
  this->ReadBuffer[0x2b] = 0;
  this->ReadBuffer[0x24] = 0;
  this->ReadBuffer[0x25] = 0;
  this->ReadBuffer[0x26] = 0;
  this->ReadBuffer[0x27] = 0;
  this->ReadBuffer[0x20] = 0;
  this->ReadBuffer[0x21] = 0;
  this->ReadBuffer[0x22] = 0;
  this->ReadBuffer[0x23] = 0;
  this->ReadBuffer[0x1c] = 0;
  this->ReadBuffer[0x1d] = 0;
  this->ReadBuffer[0x1e] = 0;
  this->ReadBuffer[0x1f] = 0;
  this->ReadBuffer[0x18] = 0;
  this->ReadBuffer[0x19] = 0;
  this->ReadBuffer[0x1a] = 0;
  this->ReadBuffer[0x1b] = 0;
  this->ReadBuffer[0x14] = 0;
  this->ReadBuffer[0x15] = 0;
  this->ReadBuffer[0x16] = 0;
  this->ReadBuffer[0x17] = 0;
  this->ReadBuffer[0x10] = 0;
  this->ReadBuffer[0x11] = 0;
  this->ReadBuffer[0x12] = 0;
  this->ReadBuffer[0x13] = 0;
  this->ReadBuffer[0xc] = 0;
  this->ReadBuffer[0xd] = 0;
  this->ReadBuffer[0xe] = 0;
  this->ReadBuffer[0xf] = 0;
  this->ReadBuffer[8] = 0;
  this->ReadBuffer[9] = 0;
  this->ReadBuffer[10] = 0;
  this->ReadBuffer[0xb] = 0;
  this->ReadBuffer[4] = 0;
  this->ReadBuffer[5] = 0;
  this->ReadBuffer[6] = 0;
  this->ReadBuffer[7] = 0;
  this->ReadBuffer[0] = 0;
  this->ReadBuffer[1] = 0;
  this->ReadBuffer[2] = 0;
  this->ReadBuffer[3] = 0;
  this->WriteBuffer[0x3c] = 0;
  this->WriteBuffer[0x3d] = 0;
  this->WriteBuffer[0x3e] = 0;
  this->WriteBuffer[0x3f] = 0;
  this->WriteBuffer[0x38] = 0;
  this->WriteBuffer[0x39] = 0;
  this->WriteBuffer[0x3a] = 0;
  this->WriteBuffer[0x3b] = 0;
  this->WriteBuffer[0x34] = 0;
  this->WriteBuffer[0x35] = 0;
  this->WriteBuffer[0x36] = 0;
  this->WriteBuffer[0x37] = 0;
  this->WriteBuffer[0x30] = 0;
  this->WriteBuffer[0x31] = 0;
  this->WriteBuffer[0x32] = 0;
  this->WriteBuffer[0x33] = 0;
  this->WriteBuffer[0x2c] = 0;
  this->WriteBuffer[0x2d] = 0;
  this->WriteBuffer[0x2e] = 0;
  this->WriteBuffer[0x2f] = 0;
  this->WriteBuffer[0x28] = 0;
  this->WriteBuffer[0x29] = 0;
  this->WriteBuffer[0x2a] = 0;
  this->WriteBuffer[0x2b] = 0;
  this->WriteBuffer[0x24] = 0;
  this->WriteBuffer[0x25] = 0;
  this->WriteBuffer[0x26] = 0;
  this->WriteBuffer[0x27] = 0;
  this->WriteBuffer[0x20] = 0;
  this->WriteBuffer[0x21] = 0;
  this->WriteBuffer[0x22] = 0;
  this->WriteBuffer[0x23] = 0;
  this->WriteBuffer[0x1c] = 0;
  this->WriteBuffer[0x1d] = 0;
  this->WriteBuffer[0x1e] = 0;
  this->WriteBuffer[0x1f] = 0;
  this->WriteBuffer[0x18] = 0;
  this->WriteBuffer[0x19] = 0;
  this->WriteBuffer[0x1a] = 0;
  this->WriteBuffer[0x1b] = 0;
  this->WriteBuffer[0x14] = 0;
  this->WriteBuffer[0x15] = 0;
  this->WriteBuffer[0x16] = 0;
  this->WriteBuffer[0x17] = 0;
  this->WriteBuffer[0x10] = 0;
  this->WriteBuffer[0x11] = 0;
  this->WriteBuffer[0x12] = 0;
  this->WriteBuffer[0x13] = 0;
  this->WriteBuffer[0xc] = 0;
  this->WriteBuffer[0xd] = 0;
  this->WriteBuffer[0xe] = 0;
  this->WriteBuffer[0xf] = 0;
  this->WriteBuffer[8] = 0;
  this->WriteBuffer[9] = 0;
  this->WriteBuffer[10] = 0;
  this->WriteBuffer[0xb] = 0;
  this->WriteBuffer[4] = 0;
  this->WriteBuffer[5] = 0;
  this->WriteBuffer[6] = 0;
  this->WriteBuffer[7] = 0;
  this->WriteBuffer[0] = 0;
  this->WriteBuffer[1] = 0;
  this->WriteBuffer[2] = 0;
  this->WriteBuffer[3] = 0;
  (**(this->super_FpgaIO).super_BoardIO._vptr_BoardIO)();
  return;
}

Assistant:

AmpIO::AmpIO(uint8_t board_id) : FpgaIO(board_id), NumMotors(0), NumEncoders(0), NumDouts(0),
                                     dallasState(ST_DALLAS_START), dallasTimeoutSec(10.0), collect_state(false), collect_cb(0)
{
    memset(ReadBuffer, 0, sizeof(ReadBuffer));
    memset(WriteBuffer, 0, sizeof(WriteBuffer));
    // Calling InitBoard here will initialize as a 4-axis QLA.
    // InitBoard should be called again from BasePort::AddBoard
    InitBoard();
}